

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.h
# Opt level: O2

R_conflict12 __thiscall
QtPrivate::
q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
::operator()(q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
             *this,char16_t *first,char16_t *last,char *pat_first,char *pat_last)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  R_conflict12 RVar8;
  R_conflict12 RVar9;
  
  uVar5 = (long)pat_last - (long)pat_first;
  if (uVar5 == 0) {
    RVar9.end = first;
    RVar9.begin = first;
    return RVar9;
  }
  pcVar1 = first + (uVar5 - 1);
  uVar6 = 0;
  if (0 < (long)uVar5) {
    uVar6 = uVar5;
  }
  do {
    pcVar2 = last;
    if (last <= pcVar1) {
LAB_002d704a:
      RVar8.end = pcVar2;
      RVar8.begin = last;
      return RVar8;
    }
    uVar4 = (ulong)(byte)this[(byte)*pcVar1];
    if (uVar4 == 0) {
      lVar7 = 0;
      lVar3 = (long)pat_first - (long)pat_last;
      while( true ) {
        if (-lVar7 == uVar6) {
          last = pcVar1 + (1 - uVar6);
          pcVar2 = pcVar1 + ((uVar5 + 1) - uVar6);
          goto LAB_002d704a;
        }
        if (pat_first[lVar7 + (uVar5 - 1)] != (byte)pcVar1[lVar7]) break;
        lVar3 = lVar3 + 1;
        lVar7 = lVar7 + -1;
      }
      uVar4 = -lVar3;
      if (uVar5 != (byte)this[(byte)pcVar1[lVar7]]) {
        uVar4 = 1;
      }
    }
    pcVar1 = pcVar1 + uVar4;
  } while( true );
}

Assistant:

constexpr auto operator()(RandomIt2 first, RandomIt2 last, RandomIt1 pat_first,
                              RandomIt1 pat_last) const
    {
        struct R
        {
            RandomIt2 begin, end;
        };
        Hash hf;
        BinaryPredicate pred;
        auto pat_length = std::distance(pat_first, pat_last);
        if (pat_length == 0)
            return R{ first, first };

        const qsizetype pl_minus_one = qsizetype(pat_length - 1);
        RandomIt2 current = first + pl_minus_one;

        while (current < last) {
            qsizetype skip = m_skiptable[hf(*current)];
            if (!skip) {
                // possible match
                while (skip < pat_length) {
                    if (!pred(hf(*(current - skip)), uchar(pat_first[pl_minus_one - skip])))
                        break;
                    skip++;
                }
                if (skip > pl_minus_one) { // we have a match
                    auto match = current - skip + 1;
                    return R{ match, match + pat_length };
                }

                // If we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (m_skiptable[hf(*(current - skip))] == pat_length)
                    skip = pat_length - skip;
                else
                    skip = 1;
            }
            current += skip;
        }

        return R{ last, last };
    }